

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestTailCalleeImpl::foo(TestTailCalleeImpl *this,FooContext context)

{
  CapTableReader *pCVar1;
  ClientHook *pCVar2;
  undefined8 *puVar3;
  long *in_RDX;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Reader value;
  Own<capnp::ClientHook,_std::nullptr_t> OVar9;
  Builder results;
  Reader params;
  PointerReader local_e8;
  SegmentBuilder *local_c0;
  Own<capnp::ClientHook,_std::nullptr_t> OStack_b8;
  StructBuilder local_a8;
  StructReader local_78;
  undefined1 local_48;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_e8);
  local_a8.pointers = (WirePointer *)CONCAT44(local_e8._28_4_,local_e8.nestingLimit);
  local_a8.data = local_e8.pointer;
  local_a8.segment = (SegmentBuilder *)local_e8.segment;
  local_a8.capTable = (CapTableBuilder *)local_e8.capTable;
  uVar4 = 0;
  PointerReader::getStruct(&local_78,(PointerReader *)&local_a8,(word *)0x0);
  local_48 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_c0);
  local_e8.pointer = (WirePointer *)OStack_b8.ptr;
  local_e8.segment = &local_c0->super_SegmentReader;
  local_e8.capTable = (CapTableReader *)OStack_b8.disposer;
  PointerBuilder::getStruct(&local_a8,(PointerBuilder *)&local_e8,(StructSize)0x20001,(word *)0x0);
  if (0x1f < local_78.dataSize) {
    uVar4 = *local_78.data;
  }
  ((WireValue<uint32_t> *)local_a8.data)->value = uVar4;
  if (local_78.pointerCount == 0) {
    local_78.pointers = (WirePointer *)0x0;
    local_78.nestingLimit = 0x7fffffff;
  }
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  if (local_78.pointerCount != 0) {
    uVar5 = local_78.segment._0_4_;
    uVar6 = local_78.segment._4_4_;
    uVar7 = local_78.capTable._0_4_;
    uVar8 = local_78.capTable._4_4_;
  }
  local_e8.segment = (SegmentReader *)CONCAT44(uVar6,uVar5);
  local_e8.capTable = (CapTableReader *)CONCAT44(uVar8,uVar7);
  local_e8.pointer = local_78.pointers;
  local_e8.nestingLimit = local_78.nestingLimit;
  value = PointerReader::getBlob<capnp::Text>(&local_e8,(void *)0x0,0);
  local_e8.segment = &(local_a8.segment)->super_SegmentReader;
  local_e8.capTable = &(local_a8.capTable)->super_CapTableReader;
  local_e8.pointer = local_a8.pointers;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_e8,value);
  puVar3 = (undefined8 *)operator_new(0x20);
  local_e8.capTable = (CapTableReader *)(puVar3 + 2);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0x36e268;
  puVar3[2] = 0x36e2a0;
  local_e8.segment = (SegmentReader *)&kj::_::HeapDisposer<capnp::_::TestCallOrderImpl>::instance;
  OVar9 = Capability::Client::makeLocalClient
                    ((Client *)&OStack_b8,
                     (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_e8);
  pCVar1 = local_e8.capTable;
  if (local_e8.capTable != (CapTableReader *)0x0) {
    local_e8.capTable = (CapTableReader *)0x0;
    (*(code *)(local_e8.segment)->arena->_vptr_Arena)
              (local_e8.segment,
               (_func_int *)
               ((long)&pCVar1->_vptr_CapTableReader + (long)pCVar1->_vptr_CapTableReader[-2]),
               OVar9.ptr);
  }
  local_c0 = (SegmentBuilder *)capnproto_test::capnp::test::TestHandle::Client::vtable;
  local_e8.pointer = local_a8.pointers + 1;
  local_e8.segment = &(local_a8.segment)->super_SegmentReader;
  local_e8.capTable = &(local_a8.capTable)->super_CapTableReader;
  PointerBuilder::setCapability((PointerBuilder *)&local_e8,&OStack_b8);
  pCVar2 = OStack_b8.ptr;
  if (OStack_b8.ptr != (ClientHook *)0x0) {
    OStack_b8.ptr = (ClientHook *)0x0;
    (**(OStack_b8.disposer)->_vptr_Disposer)
              (OStack_b8.disposer,
               (long)&((WireValue<uint32_t> *)&pCVar2->_vptr_ClientHook)->value +
               *(long *)(*(long *)&pCVar2->_vptr_ClientHook + -0x10));
  }
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestTailCalleeImpl::foo(FooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto results = context.getResults();

  results.setI(params.getI());
  results.setT(params.getT());
  results.setC(kj::heap<TestCallOrderImpl>());

  return kj::READY_NOW;
}